

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void gola_fixup(LexState *ls,FuncScope *bl)

{
  LexState *pLVar1;
  VarInfo *vg_00;
  byte bVar2;
  LexState *in_RSI;
  LexState *in_RDI;
  VarInfo *vg;
  GCstr *name;
  VarInfo *ve;
  VarInfo *v;
  LexState *vl;
  LexState *ls_00;
  LexState *vg_01;
  
  vg_01 = (LexState *)(in_RDI->vstack + *(uint *)&in_RSI->L);
  ls_00 = (LexState *)(in_RDI->vstack + in_RDI->vtop);
  do {
    if (ls_00 <= vg_01) {
      return;
    }
    vg_00 = (VarInfo *)(ulong)*(uint *)&vg_01->fs;
    if (vg_00 != (VarInfo *)0x0) {
      if (((ulong)vg_01->L & 0x40000000000) == 0) {
        if (((ulong)vg_01->L & 0x20000000000) != 0) {
          if (in_RSI->fs == (FuncState *)0x0) {
            in_RDI->linenumber = in_RDI->fs->bcbase[*(uint *)((long)&vg_01->fs + 4)].line;
            if (vg_00 != (VarInfo *)0x1) {
              lj_lex_error(in_RDI,0,LJ_ERR_XLUNDEF,vg_00 + 1);
            }
            lj_lex_error(in_RDI,0,LJ_ERR_XBREAK);
          }
          bVar2 = 4;
          if (vg_00 == (VarInfo *)0x1) {
            bVar2 = 2;
          }
          *(byte *)((long)&in_RSI->fs->ls + 5) = *(byte *)((long)&in_RSI->fs->ls + 5) | bVar2;
          *(undefined1 *)((long)&vg_01->L + 4) = *(undefined1 *)((long)&in_RSI->L + 4);
          if (((ulong)in_RSI->L & 0x80000000000) != 0) {
            gola_close(in_RSI,(VarInfo *)vg_01);
          }
        }
      }
      else {
        *(undefined4 *)&vg_01->fs = 0;
        vl = vg_01;
        while (pLVar1 = vl, vl = (LexState *)&pLVar1->tokval, vl < ls_00) {
          if (((VarInfo *)(ulong)((anon_struct_8_2_f9ee98fb_for_u32 *)vl)->lo == vg_00) &&
             (((pLVar1->lookaheadval).u64 & 0x20000000000) != 0)) {
            if ((((ulong)in_RSI->L & 0x80000000000) != 0) &&
               (*(byte *)((long)&vg_01->L + 4) < *(byte *)((long)&pLVar1->lookaheadval + 4))) {
              gola_close(in_RSI,(VarInfo *)vg_01);
            }
            gola_patch(ls_00,vg_00,(VarInfo *)vl);
          }
        }
      }
    }
    vg_01 = (LexState *)&vg_01->tokval;
  } while( true );
}

Assistant:

static void gola_fixup(LexState *ls, FuncScope *bl)
{
  VarInfo *v = ls->vstack + bl->vstart;
  VarInfo *ve = ls->vstack + ls->vtop;
  for (; v < ve; v++) {
    GCstr *name = strref(v->name);
    if (name != NULL) {  /* Only consider remaining valid gotos/labels. */
      if (gola_islabel(v)) {
	VarInfo *vg;
	setgcrefnull(v->name);  /* Invalidate label that goes out of scope. */
	for (vg = v+1; vg < ve; vg++)  /* Resolve pending backward gotos. */
	  if (strref(vg->name) == name && gola_isgoto(vg)) {
	    if ((bl->flags&FSCOPE_UPVAL) && vg->slot > v->slot)
	      gola_close(ls, vg);
	    gola_patch(ls, vg, v);
	  }
      } else if (gola_isgoto(v)) {
	if (bl->prev) {  /* Propagate goto or break to outer scope. */
	  bl->prev->flags |= name == NAME_BREAK ? FSCOPE_BREAK : FSCOPE_GOLA;
	  v->slot = bl->nactvar;
	  if ((bl->flags & FSCOPE_UPVAL))
	    gola_close(ls, v);
	} else {  /* No outer scope: undefined goto label or no loop. */
	  ls->linenumber = ls->fs->bcbase[v->startpc].line;
	  if (name == NAME_BREAK)
	    lj_lex_error(ls, 0, LJ_ERR_XBREAK);
	  else
	    lj_lex_error(ls, 0, LJ_ERR_XLUNDEF, strdata(name));
	}
      }
    }
  }
}